

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgesture.cpp
# Opt level: O0

void QPinchGesture::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QPointF *value;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  qreal qVar2;
  QPointF QVar3;
  void *_v_1;
  void *_v;
  QPinchGesture *_t;
  undefined8 in_stack_ffffffffffffff68;
  QFlagsStorage<QPinchGesture::ChangeFlag> t;
  QPinchGesture *in_stack_ffffffffffffff70;
  QPinchGesture *this;
  QPinchGesture *in_stack_ffffffffffffff78;
  qreal local_38;
  qreal local_30;
  qreal local_28;
  qreal local_20;
  qreal local_18;
  qreal local_10;
  
  t.i = (Int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    this = (QPinchGesture *)*in_RCX;
    switch(in_EDX) {
    case 0:
      totalChangeFlags(in_stack_ffffffffffffff70);
      QtMocHelpers::assignFlags<QFlags<QPinchGesture::ChangeFlag>>
                ((void *)0x2fdeaf,(QFlags<QPinchGesture::ChangeFlag>)t.i);
      break;
    case 1:
      changeFlags(this);
      QtMocHelpers::assignFlags<QFlags<QPinchGesture::ChangeFlag>>
                ((void *)0x2fdeda,(QFlags<QPinchGesture::ChangeFlag>)t.i);
      in_stack_ffffffffffffff70 = this;
      break;
    case 2:
      qVar2 = totalScaleFactor((QPinchGesture *)0x2fdee9);
      *(qreal *)&this->super_QGesture = qVar2;
      break;
    case 3:
      qVar2 = lastScaleFactor((QPinchGesture *)0x2fdf01);
      *(qreal *)&this->super_QGesture = qVar2;
      break;
    case 4:
      qVar2 = scaleFactor((QPinchGesture *)0x2fdf19);
      *(qreal *)&this->super_QGesture = qVar2;
      break;
    case 5:
      qVar2 = totalRotationAngle((QPinchGesture *)0x2fdf31);
      *(qreal *)&this->super_QGesture = qVar2;
      break;
    case 6:
      qVar2 = lastRotationAngle((QPinchGesture *)0x2fdf49);
      *(qreal *)&this->super_QGesture = qVar2;
      break;
    case 7:
      qVar2 = rotationAngle((QPinchGesture *)0x2fdf61);
      *(qreal *)&this->super_QGesture = qVar2;
      break;
    case 8:
      QVar3 = startCenterPoint(in_stack_ffffffffffffff78);
      local_18 = QVar3.xp;
      *(qreal *)&this->super_QGesture = local_18;
      local_10 = QVar3.yp;
      *(qreal *)&(this->super_QGesture).field_0x8 = local_10;
      break;
    case 9:
      QVar3 = lastCenterPoint(in_stack_ffffffffffffff78);
      local_28 = QVar3.xp;
      *(qreal *)&this->super_QGesture = local_28;
      local_20 = QVar3.yp;
      *(qreal *)&(this->super_QGesture).field_0x8 = local_20;
      break;
    case 10:
      QVar3 = centerPoint(in_stack_ffffffffffffff78);
      local_38 = QVar3.xp;
      *(qreal *)&this->super_QGesture = local_38;
      local_30 = QVar3.yp;
      *(qreal *)&(this->super_QGesture).field_0x8 = local_30;
    }
  }
  if (in_ESI == 2) {
    value = (QPointF *)(ulong)in_EDX;
    switch(value) {
    case (QPointF *)0x0:
      setTotalChangeFlags((QPinchGesture *)0x2fe061,(ChangeFlags)0x0);
      break;
    case (QPointF *)0x1:
      setChangeFlags((QPinchGesture *)0x2fe07f,(ChangeFlags)0x0);
      break;
    case (QPointF *)0x2:
      setTotalScaleFactor(in_stack_ffffffffffffff70,(qreal)value);
      break;
    case (QPointF *)0x3:
      setLastScaleFactor(in_stack_ffffffffffffff70,(qreal)value);
      break;
    case (QPointF *)0x4:
      setScaleFactor(in_stack_ffffffffffffff70,(qreal)value);
      break;
    case (QPointF *)0x5:
      setTotalRotationAngle(in_stack_ffffffffffffff70,(qreal)value);
      break;
    case (QPointF *)0x6:
      setLastRotationAngle(in_stack_ffffffffffffff70,(qreal)value);
      break;
    case (QPointF *)0x7:
      setRotationAngle(in_stack_ffffffffffffff70,(qreal)value);
      break;
    case (QPointF *)0x8:
      setStartCenterPoint(in_stack_ffffffffffffff70,value);
      break;
    case (QPointF *)0x9:
      setLastCenterPoint(in_stack_ffffffffffffff70,value);
      break;
    case (QPointF *)0xa:
      setCenterPoint(in_stack_ffffffffffffff70,value);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPinchGesture::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPinchGesture *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<ChangeFlags>(_v, _t->totalChangeFlags()); break;
        case 1: QtMocHelpers::assignFlags<ChangeFlags>(_v, _t->changeFlags()); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->totalScaleFactor(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->lastScaleFactor(); break;
        case 4: *reinterpret_cast<qreal*>(_v) = _t->scaleFactor(); break;
        case 5: *reinterpret_cast<qreal*>(_v) = _t->totalRotationAngle(); break;
        case 6: *reinterpret_cast<qreal*>(_v) = _t->lastRotationAngle(); break;
        case 7: *reinterpret_cast<qreal*>(_v) = _t->rotationAngle(); break;
        case 8: *reinterpret_cast<QPointF*>(_v) = _t->startCenterPoint(); break;
        case 9: *reinterpret_cast<QPointF*>(_v) = _t->lastCenterPoint(); break;
        case 10: *reinterpret_cast<QPointF*>(_v) = _t->centerPoint(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTotalChangeFlags(*reinterpret_cast<ChangeFlags*>(_v)); break;
        case 1: _t->setChangeFlags(*reinterpret_cast<ChangeFlags*>(_v)); break;
        case 2: _t->setTotalScaleFactor(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setLastScaleFactor(*reinterpret_cast<qreal*>(_v)); break;
        case 4: _t->setScaleFactor(*reinterpret_cast<qreal*>(_v)); break;
        case 5: _t->setTotalRotationAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 6: _t->setLastRotationAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 7: _t->setRotationAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 8: _t->setStartCenterPoint(*reinterpret_cast<QPointF*>(_v)); break;
        case 9: _t->setLastCenterPoint(*reinterpret_cast<QPointF*>(_v)); break;
        case 10: _t->setCenterPoint(*reinterpret_cast<QPointF*>(_v)); break;
        default: break;
        }
    }
}